

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O0

_Bool StringToken_GetNext(STRING_TOKEN_HANDLE token,char **delimiters,size_t n_delims)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  _Bool result;
  size_t n_delims_local;
  char **delimiters_local;
  STRING_TOKEN_HANDLE token_local;
  
  if (((token == (STRING_TOKEN_HANDLE)0x0) || (delimiters == (char **)0x0)) || (n_delims == 0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                ,"StringToken_GetNext",0xcd,1,
                "Invalid argument (token=%p, delimiters=%p, n_delims=%lu)",token,delimiters,n_delims
               );
    }
    l._7_1_ = false;
  }
  else {
    iVar1 = get_next_token(token,delimiters,n_delims);
    l._7_1_ = iVar1 == 0;
  }
  return l._7_1_;
}

Assistant:

bool StringToken_GetNext(STRING_TOKEN_HANDLE token, const char** delimiters, size_t n_delims)
{
    bool result;

    // Codes_SRS_STRING_TOKENIZER_09_008: [ If token or delimiters are NULL, or n_delims is zero, the function shall return false ]
    if (token == NULL || delimiters == NULL || n_delims == 0)
    {
        LogError("Invalid argument (token=%p, delimiters=%p, n_delims=%lu)", token, delimiters, (unsigned long)n_delims);
        result = false;
    }
    else if (get_next_token(token, delimiters, n_delims) != 0)
    {
        // Codes_SRS_STRING_TOKENIZER_09_009: [ If the previous token already extended to the end of source, the function shall return false ]
        result = false;
    }
    else
    {
        // Codes_SRS_STRING_TOKENIZER_09_012: [ If a token was identified, the function shall return true ]
        result = true;
    }

    return result;
}